

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::ShellCommand::processMakefileDiscoveredDependencies(llbuild::buildsystem::
BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::StringRef,llvm::
MemoryBuffer*,bool)::DepsActions::actOnRuleDependency(llvm::StringRef,llvm::StringRef_
          (void *this,StringRef dependency,StringRef unescapedWord)

{
  char *in_start;
  StringRef str;
  bool bVar1;
  BuildSystemDelegate *pBVar2;
  StringRef str_00;
  SmallString<4096U> absPath;
  StringRef local_10c0;
  Child local_10b0;
  long local_10a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10a0;
  Child local_1090;
  long local_1088;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1080;
  Twine local_1070;
  Twine local_1058;
  Child local_1040;
  uint local_1038;
  undefined4 uStack_1034;
  Child local_1030 [512];
  
  local_10c0.Length = unescapedWord.Length;
  local_10c0.Data = unescapedWord.Data;
  llvm::Twine::Twine((Twine *)&local_1040,&local_10c0);
  bVar1 = llvm::sys::path::is_absolute((Twine *)&local_1040,native);
  if (bVar1) {
    str.Length = local_10c0.Length;
    str.Data = local_10c0.Data;
    BuildKey::BuildKey((BuildKey *)&local_10b0,'N',str);
    local_1040.twine = (Twine *)local_1030;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1040,local_10b0.twine,(long)&(local_10b0.twine)->LHS + local_10a8);
    llbuild::core::TaskInterface::discoveredDependency
              ((TaskInterface *)((long)this + 0x10),(KeyType *)&local_1040);
    if (local_1040.twine != (Twine *)local_1030) {
      operator_delete(local_1040.twine,(ulong)((long)&(local_1030[0].twine)->LHS + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10b0.twine != &local_10a0) {
      operator_delete(local_10b0.twine,local_10a0._M_allocated_capacity + 1);
    }
    pBVar2 = BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
    (*pBVar2->_vptr_BuildSystemDelegate[0xf])
              (pBVar2,*(undefined8 *)((long)this + 0x20),local_10c0.Data,local_10c0.Length,0);
  }
  else {
    in_start = *(char **)(*(long *)((long)this + 0x20) + 0x1d8);
    local_1040.twine = (Twine *)local_1030;
    local_1038 = 0;
    uStack_1034 = 0x1000;
    llvm::SmallVectorImpl<char>::append<char_const*,void>
              ((SmallVectorImpl<char> *)&local_1040,in_start,
               in_start + *(long *)(*(long *)((long)this + 0x20) + 0x1e0));
    llvm::Twine::Twine((Twine *)&local_10b0,&local_10c0);
    llvm::Twine::Twine((Twine *)&local_1090,"");
    llvm::Twine::Twine(&local_1058,"");
    llvm::Twine::Twine(&local_1070,"");
    llvm::sys::path::append
              ((SmallVectorImpl<char> *)&local_1040,(Twine *)&local_10b0,(Twine *)&local_1090,
               &local_1058,&local_1070);
    llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)&local_1040);
    str_00.Length._0_4_ = local_1038;
    str_00.Data = local_1040.cString;
    str_00.Length._4_4_ = 0;
    BuildKey::BuildKey((BuildKey *)&local_1090,'N',str_00);
    local_10b0.twine = (Twine *)&local_10a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_10b0,local_1090.twine,(long)&(local_1090.twine)->LHS + local_1088);
    llbuild::core::TaskInterface::discoveredDependency
              ((TaskInterface *)((long)this + 0x10),(KeyType *)&local_10b0);
    if (local_10b0.twine != (Twine *)&local_10a0) {
      operator_delete(local_10b0.twine,local_10a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1090.twine != &local_1080) {
      operator_delete(local_1090.twine,local_1080._M_allocated_capacity + 1);
    }
    pBVar2 = BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
    (*pBVar2->_vptr_BuildSystemDelegate[0xf])
              (pBVar2,*(undefined8 *)((long)this + 0x20),local_1040.twine,(ulong)local_1038,0);
    if (&(local_1040.twine)->LHS != local_1030) {
      free(local_1040.twine);
    }
  }
  return;
}

Assistant:

virtual void actOnRuleDependency(StringRef dependency,
                                     StringRef unescapedWord) override {
      if (llvm::sys::path::is_absolute(unescapedWord)) {
        ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, unescapedWord, DiscoveredDependencyKind::Input);
        return;
      }

      // Generate absolute path
      //
      // NOTE: This is making the assumption that relative paths coming in a
      // dependency file are in relation to the explictly set working
      // directory, or the current working directory when it has not been set.
      SmallString<PATH_MAX> absPath = StringRef(command->workingDirectory);
      llvm::sys::path::append(absPath, unescapedWord);
      llvm::sys::fs::make_absolute(absPath);

      ti.discoveredDependency(BuildKey::makeNode(absPath).toData());
      system.getDelegate().commandFoundDiscoveredDependency(command, absPath, DiscoveredDependencyKind::Input);
    }